

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void __thiscall Overlay_Window::resize(Overlay_Window *this,int X,int Y,int W,int H)

{
  int iVar1;
  Fl_Widget *o;
  Fl_Widget *t;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Overlay_Window *this_local;
  
  o = Fl_Group::resizable((Fl_Group *)this);
  Fl_Group::resizable((Fl_Group *)this,(Fl_Widget *)0x0);
  iVar1 = Fl_Widget::w((Fl_Widget *)this);
  if (W == iVar1) {
    iVar1 = Fl_Widget::h((Fl_Widget *)this);
    if (H == iVar1) goto LAB_001a8891;
  }
  set_modflag(1);
LAB_001a8891:
  Fl_Overlay_Window::resize(&this->super_Fl_Overlay_Window,X,Y,W,H);
  Fl_Group::resizable((Fl_Group *)this,o);
  update_xywh();
  return;
}

Assistant:

void Overlay_Window::resize(int X,int Y,int W,int H) {
  Fl_Widget* t = resizable(); resizable(0);

  // do not set the mod flag if the window was not resized. In FLUID, all
  // windows are opened without a given x/y position, so modifying x/y
  // should not mark the project as dirty
  if (W!=w() || H!=h())
    set_modflag(1);

  Fl_Overlay_Window::resize(X,Y,W,H);
  resizable(t);
  update_xywh();
}